

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O2

void google::protobuf::util::converter::InitWellKnownTypes(void)

{
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_31;
  
  well_known_types__abi_cxx11_ =
       (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        *)operator_new(0x30);
  *(undefined4 *)(well_known_types__abi_cxx11_ + 8) = 0;
  *(undefined8 *)(well_known_types__abi_cxx11_ + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    **)(well_known_types__abi_cxx11_ + 0x18) = well_known_types__abi_cxx11_ + 8;
  *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    **)(well_known_types__abi_cxx11_ + 0x20) = well_known_types__abi_cxx11_ + 8;
  *(undefined8 *)(well_known_types__abi_cxx11_ + 0x28) = 0;
  for (lVar1 = 0; this = well_known_types__abi_cxx11_, lVar1 != 0xc; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string
              ((string *)&local_58,(char *)(&well_known_types_name_array_)[lVar1],&local_31);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  protobuf::internal::OnShutdown(DeleteWellKnownTypes);
  return;
}

Assistant:

void InitWellKnownTypes() {
  well_known_types_ = new std::set<std::string>;
  for (int i = 0; i < GOOGLE_ARRAYSIZE(well_known_types_name_array_); ++i) {
    well_known_types_->insert(well_known_types_name_array_[i]);
  }
  google::protobuf::internal::OnShutdown(&DeleteWellKnownTypes);
}